

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phrase_test.cpp
# Opt level: O0

void __thiscall
jhu::thrax::PhraseTests_Inconsistent_Test::TestBody(PhraseTests_Inconsistent_Test *this)

{
  bool bVar1;
  char *message;
  char *in_RCX;
  char *in_R9;
  string_view sv;
  string local_a0;
  AssertHelper local_80;
  Message local_78 [3];
  undefined8 local_60;
  bool local_51;
  undefined1 local_50 [8];
  AssertionResult gtest_ar_;
  SpanPair sp;
  char *local_30;
  undefined1 local_28 [8];
  Alignment a;
  PhraseTests_Inconsistent_Test *this_local;
  
  a.super__Vector_base<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&sp,"0-0 1-2 2-1");
  sv._M_str = in_RCX;
  sv._M_len = (size_t)local_30;
  readAlignment((Alignment *)local_28,(thrax *)sp,sv);
  gtest_ar_.message_.ptr_._0_2_ = 0;
  gtest_ar_.message_.ptr_._2_2_ = 1;
  gtest_ar_.message_.ptr_._4_2_ = 0;
  gtest_ar_.message_.ptr_._6_2_ = 3;
  local_60 = 0x3000000010000;
  bVar1 = isConsistent((Alignment *)local_28,(SpanPair)0x3000000010000);
  local_51 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_50,&local_51,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_50);
  if (!bVar1) {
    testing::Message::Message(local_78);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_a0,(internal *)local_50,(AssertionResult *)"isConsistent(a, sp)","true",
               "false",in_R9);
    message = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jweese[P]thrax2/test/phrase_test.cpp"
               ,0x32,message);
    testing::internal::AssertHelper::operator=(&local_80,local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    std::__cxx11::string::~string((string *)&local_a0);
    testing::Message::~Message(local_78);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
  std::vector<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>::~vector
            ((vector<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_> *)local_28);
  return;
}

Assistant:

TEST(PhraseTests, Inconsistent) {
  auto a = readAlignment("0-0 1-2 2-1");
  SpanPair sp{{0, 1}, {0, 3}};
  EXPECT_FALSE(isConsistent(a, sp));
}